

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O1

void ImGui_ImplOpenGL2_DestroyFontsTexture(void)

{
  int *piVar1;
  ImGuiIO *pIVar2;
  ImGuiIO *pIVar3;
  
  pIVar2 = ImGui::GetIO();
  ImGui::GetCurrentContext();
  pIVar3 = ImGui::GetIO();
  piVar1 = (int *)pIVar3->BackendRendererUserData;
  if (*piVar1 != 0) {
    glDeleteTextures(1,piVar1);
    pIVar2->Fonts->TexID = (ImTextureID)0x0;
    *piVar1 = 0;
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_DestroyFontsTexture()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplOpenGL2_Data* bd = ImGui_ImplOpenGL2_GetBackendData();
    if (bd->FontTexture)
    {
        glDeleteTextures(1, &bd->FontTexture);
        io.Fonts->SetTexID(0);
        bd->FontTexture = 0;
    }
}